

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_long_long>_>::rehash
          (Data<QHashPrivate::Node<QByteArray,_long_long>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  Entry *pEVar2;
  byte bVar3;
  ulong uVar4;
  Span *pSVar5;
  Entry *pEVar6;
  Data *pDVar7;
  char *pcVar8;
  qsizetype qVar9;
  longlong lVar10;
  Node<QByteArray,_long_long> *pNVar11;
  ulong uVar12;
  Span *pSVar13;
  size_t index;
  long lVar14;
  size_t sVar15;
  long lVar16;
  R RVar17;
  Bucket BVar18;
  QByteArrayView QVar19;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar15 = 0x80;
  if ((0x40 < sizeHint) && (sVar15 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar14 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    sVar15 = 1L << (0x41 - ((byte)lVar14 ^ 0x3f) & 0x3f);
  }
  uVar4 = this->numBuckets;
  pSVar5 = this->spans;
  RVar17 = allocateSpans(sVar15);
  this->spans = (Span *)RVar17.spans;
  this->numBuckets = sVar15;
  if (uVar4 < 0x80) {
    if (pSVar5 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar12 = 0;
    pSVar13 = pSVar5;
    do {
      lVar14 = 0;
      do {
        bVar3 = pSVar13->offsets[lVar14];
        if (bVar3 != 0xff) {
          pEVar6 = pSVar5[uVar12].entries;
          QVar19.m_data = *(storage_type **)(pEVar6[bVar3].storage.data + 8);
          QVar19.m_size = *(qsizetype *)(pEVar6[bVar3].storage.data + 0x10);
          sVar15 = qHash(QVar19,this->seed);
          BVar18 = findBucketWithHash<QByteArray>(this,(QByteArray *)(pEVar6 + bVar3),sVar15);
          pNVar11 = Span<QHashPrivate::Node<QByteArray,_long_long>_>::insert
                              (BVar18.span,BVar18.index);
          pDVar7 = *(Data **)pEVar6[bVar3].storage.data;
          pEVar2 = pEVar6 + bVar3;
          (pEVar2->storage).data[0] = '\0';
          (pEVar2->storage).data[1] = '\0';
          (pEVar2->storage).data[2] = '\0';
          (pEVar2->storage).data[3] = '\0';
          (pEVar2->storage).data[4] = '\0';
          (pEVar2->storage).data[5] = '\0';
          (pEVar2->storage).data[6] = '\0';
          (pEVar2->storage).data[7] = '\0';
          (pNVar11->key).d.d = pDVar7;
          pcVar8 = *(char **)(pEVar6[bVar3].storage.data + 8);
          pEVar2 = pEVar6 + bVar3;
          (pEVar2->storage).data[8] = '\0';
          (pEVar2->storage).data[9] = '\0';
          (pEVar2->storage).data[10] = '\0';
          (pEVar2->storage).data[0xb] = '\0';
          (pEVar2->storage).data[0xc] = '\0';
          (pEVar2->storage).data[0xd] = '\0';
          (pEVar2->storage).data[0xe] = '\0';
          (pEVar2->storage).data[0xf] = '\0';
          (pNVar11->key).d.ptr = pcVar8;
          puVar1 = pEVar6[bVar3].storage.data + 0x10;
          qVar9 = *(qsizetype *)puVar1;
          lVar10 = *(longlong *)(puVar1 + 8);
          pEVar6 = pEVar6 + bVar3;
          (pEVar6->storage).data[0x10] = '\0';
          (pEVar6->storage).data[0x11] = '\0';
          (pEVar6->storage).data[0x12] = '\0';
          (pEVar6->storage).data[0x13] = '\0';
          (pEVar6->storage).data[0x14] = '\0';
          (pEVar6->storage).data[0x15] = '\0';
          (pEVar6->storage).data[0x16] = '\0';
          (pEVar6->storage).data[0x17] = '\0';
          (pNVar11->key).d.size = qVar9;
          pNVar11->value = lVar10;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x80);
      Span<QHashPrivate::Node<QByteArray,_long_long>_>::freeData(pSVar5 + uVar12);
      uVar12 = uVar12 + 1;
      pSVar13 = pSVar13 + 1;
    } while (uVar12 != uVar4 >> 7);
  }
  lVar14 = *(long *)&pSVar5[-1].allocated;
  if (lVar14 != 0) {
    lVar16 = lVar14 * 0x90;
    do {
      Span<QHashPrivate::Node<QByteArray,_long_long>_>::freeData
                ((Span<QHashPrivate::Node<QByteArray,_long_long>_> *)(pSVar5[-1].offsets + lVar16));
      lVar16 = lVar16 + -0x90;
    } while (lVar16 != 0);
  }
  operator_delete__(&pSVar5[-1].allocated,lVar14 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }